

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_tree_nodes.h
# Opt level: O0

void __thiscall
st_tree::detail::
node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>::pop_back
          (node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>
           *this)

{
  tree_type *this_00;
  reference ppnVar1;
  node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>
  *this_local;
  
  this_00 = node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
            ::tree(&this->
                    super_node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
                  );
  ppnVar1 = std::
            vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
            ::back(&(this->
                    super_node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
                    )._children);
  tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::_delete_node(this_00,*ppnVar1)
  ;
  std::
  vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
  ::pop_back(&(this->
              super_node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
              )._children);
  return;
}

Assistant:

void pop_back() {
        this->tree()._delete_node(this->_children.back());
        this->_children.pop_back();
    }